

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall
ON_RevSurface::GetParameterTolerance
          (ON_RevSurface *this,int dir,double t,double *tminus,double *tplus)

{
  ON_Curve *pOVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ON_Interval *this_00;
  double t0;
  double t1;
  
  uVar3 = (uint)(dir == 0);
  if (this->m_bTransposed == false) {
    uVar3 = dir;
  }
  if (uVar3 == 1) {
    pOVar1 = this->m_curve;
    if (pOVar1 != (ON_Curve *)0x0) {
      iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2d])
                        (pOVar1,tminus,tplus);
      return SUB41(iVar4,0);
    }
  }
  else if (uVar3 == 0) {
    this_00 = &this->m_t;
    bVar2 = ON_Interval::IsIncreasing(this_00);
    if (bVar2) {
      t0 = ON_Interval::operator[](this_00,0);
      t1 = ON_Interval::operator[](this_00,1);
      bVar2 = ON_GetParameterTolerance(t0,t1,t,tminus,tplus);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ON_RevSurface::GetParameterTolerance( // returns tminus < tplus: parameters tminus <= s <= tplus
         int dir,        // 0 gets first parameter, 1 gets second parameter
         double t,       // t = parameter in domain
         double* tminus, // tminus
         double* tplus   // tplus
         ) const
{
  bool rc = false;
  if ( m_bTransposed )
    dir = dir ? 0 : 1;
  if ( dir == 0 )
  {
    if ( m_t.IsIncreasing() )
      rc = ON_GetParameterTolerance( m_t[0], m_t[1], t, tminus, tplus );
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->GetParameterTolerance( t, tminus, tplus );
  }
  return rc;
}